

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

string * backward::TraceResolverLinuxBase::read_symlink
                   (string *__return_storage_ptr__,string *symlink_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  char *__end;
  string path;
  _Alloc_hider local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_50._M_p = &local_40;
  local_48 = 0;
  local_40 = '\0';
  std::__cxx11::string::resize((ulong)&local_50,'d');
  paVar1 = &__return_storage_ptr__->field_2;
  do {
    sVar2 = readlink((symlink_path->_M_dataplus)._M_p,local_50._M_p,local_48);
    if ((long)sVar2 < 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      iVar3 = 1;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
    }
    else if (sVar2 == local_48) {
      iVar3 = 0;
      std::__cxx11::string::resize((ulong)&local_50,(char)local_48 * '\x02');
    }
    else {
      iVar3 = 3;
      std::__cxx11::string::resize((ulong)&local_50,(char)sVar2);
    }
  } while (iVar3 == 0);
  if (iVar3 == 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if (local_50._M_p == &local_40) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    }
    __return_storage_ptr__->_M_string_length = local_48;
    local_48 = 0;
    local_40 = '\0';
    local_50._M_p = &local_40;
  }
  if (local_50._M_p != &local_40) {
    operator_delete(local_50._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string read_symlink(std::string const &symlink_path) {
    std::string path;
    path.resize(100);

    while (true) {
      ssize_t len =
          ::readlink(symlink_path.c_str(), &*path.begin(), path.size());
      if (len < 0) {
        return "";
      }
      if (static_cast<size_t>(len) == path.size()) {
        path.resize(path.size() * 2);
      } else {
        path.resize(static_cast<std::string::size_type>(len));
        break;
      }
    }

    return path;
  }